

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

int duckdb_je_ctl_bymib(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                       size_t newlen)

{
  _Bool _Var1;
  int iVar2;
  ctl_named_node_t *in_RAX;
  ctl_named_node_t *node;
  ctl_named_node_t *local_38;
  
  local_38 = in_RAX;
  if ((ctl_initialized == '\0') && (_Var1 = ctl_init(tsd), _Var1)) {
    return 0xb;
  }
  iVar2 = ctl_lookupbymib((tsdn_t *)tsd,&local_38,mib,miblen);
  if (((iVar2 == 0) && (iVar2 = 2, local_38 != (ctl_named_node_t *)0x0)) &&
     (local_38->ctl !=
      (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)) {
    iVar2 = (*local_38->ctl)(tsd,mib,miblen,oldp,oldlenp,newp,newlen);
    return iVar2;
  }
  return iVar2;
}

Assistant:

int
ctl_bymib(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookupbymib(tsd_tsdn(tsd), &node, mib, miblen);
	if (ret != 0) {
		goto label_return;
	}

	/* Call the ctl function. */
	if (node && node->ctl) {
		ret = node->ctl(tsd, mib, miblen, oldp, oldlenp, newp, newlen);
	} else {
		/* Partial MIB. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}